

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc_art.hpp
# Opt level: O0

void __thiscall
unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::
increase_memory_use(olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *this
                   ,size_t delta)

{
  size_t delta_local;
  olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *this_local;
  
  if (delta != 0) {
    LOCK();
    (this->current_memory_use).super___atomic_base<unsigned_long>._M_i =
         (this->current_memory_use).super___atomic_base<unsigned_long>._M_i + delta;
    UNLOCK();
    return;
  }
  __assert_fail("delta > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./olc_art.hpp"
                ,0xa83,
                "void unodb::olc_db<unsigned long, std::span<const std::byte>>::increase_memory_use(std::size_t) [Key = unsigned long, Value = std::span<const std::byte>]"
               );
}

Assistant:

void olc_db<Key, Value>::increase_memory_use(std::size_t delta) noexcept {
  UNODB_DETAIL_ASSERT(delta > 0);

  current_memory_use.fetch_add(delta, std::memory_order_relaxed);
}